

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::MethodPrototypeSymbol::serializeTo
          (MethodPrototypeSymbol *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  Type *__n;
  reference ppFVar2;
  SubroutineSymbol *__n_00;
  ASTSerializer *in_RSI;
  long in_RDI;
  MethodPrototypeSymbol *in_stack_00000048;
  SubroutineSymbol *sub;
  FormalArgumentSymbol *arg;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *__range2;
  Symbol *in_stack_fffffffffffffec8;
  ASTSerializer *in_stack_fffffffffffffed0;
  ASTSerializer *in_stack_fffffffffffffed8;
  ASTSerializer *in_stack_fffffffffffffee0;
  ASTSerializer *this_00;
  ASTSerializer *this_01;
  bitmask<slang::ast::MethodFlags> flags;
  int local_f0;
  void *local_e8;
  ASTSerializer local_c0;
  long local_78;
  string_view local_60;
  int local_50;
  void *local_48;
  string_view local_40;
  int local_30;
  void *local_28;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             (char *)in_stack_fffffffffffffed8);
  __n = getReturnType((MethodPrototypeSymbol *)0x9c8abf);
  ASTSerializer::write(in_RSI,local_20,local_18,(size_t)__n);
  this_00 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             (char *)in_stack_fffffffffffffed8);
  local_40 = ast::toString(Function);
  ASTSerializer::write(this_00,local_30,local_28,local_40._M_len);
  this_01 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             (char *)in_stack_fffffffffffffed8);
  local_60 = ast::toString(Public);
  ASTSerializer::write(this_01,local_50,local_48,local_60._M_len);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             (char *)in_stack_fffffffffffffed8);
  name._M_str = (char *)this_00;
  name._M_len = (size_t)in_RSI;
  ASTSerializer::startArray(in_stack_fffffffffffffee0,name);
  local_78 = in_RDI + 200;
  local_c0.visiting.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  .size_ctrl.size =
       (size_t)std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
               begin((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                     in_stack_fffffffffffffec8);
  local_c0.visiting.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  .size_ctrl.ml =
       (size_t)std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                         ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                           *)in_stack_fffffffffffffed8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffed0,
                       (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffec8);
    flags.m_bits = (underlying_type)((ulong)this_01 >> 0x30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                           *)&local_c0.visiting.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                              .size_ctrl.size);
    local_c0.visiting.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
    .arrays.elements_ = (value_type_pointer)*ppFVar2;
    ASTSerializer::serialize(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,false);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                  *)&local_c0.visiting.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                     .size_ctrl.size);
  }
  ASTSerializer::endArray((ASTSerializer *)0x9c8c92);
  bVar1 = slang::bitmask::operator_cast_to_bool((bitmask<slang::ast::MethodFlags> *)0x9c8ca3);
  if (bVar1) {
    in_stack_fffffffffffffed8 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
               (char *)local_10);
    in_stack_fffffffffffffee0 = &local_c0;
    flagsToStr_abi_cxx11_(flags);
    ASTSerializer::write
              (in_stack_fffffffffffffed8,
               (int)local_c0.visiting.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                    .arrays.groups_size_mask,
               local_c0.visiting.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
               .arrays.groups_,(size_t)in_stack_fffffffffffffee0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffed0);
  }
  __n_00 = getSubroutine(in_stack_00000048);
  if (__n_00 != (SubroutineSymbol *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
               (char *)in_stack_fffffffffffffed8);
    ASTSerializer::write(local_10,local_f0,local_e8,(size_t)__n_00);
  }
  return;
}

Assistant:

void MethodPrototypeSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("returnType", getReturnType());
    serializer.write("subroutineKind", toString(subroutineKind));
    serializer.write("visibility", toString(visibility));

    serializer.startArray("arguments");
    for (auto arg : arguments)
        serializer.serialize(*arg);
    serializer.endArray();

    if (flags)
        serializer.write("flags", flagsToStr(flags));

    if (auto* sub = getSubroutine())
        serializer.write("subroutine", *sub);
}